

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::IfcColumnType(IfcColumnType *this)

{
  IfcColumnType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcColumnType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00f67e30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>,
             &PTR_construction_vtable_24__00f67f68);
  *(undefined8 *)this = 0xf67d00;
  *(undefined8 *)&this->field_0x1c0 = 0xf67e18;
  *(undefined8 *)&this->field_0x88 = 0xf67d28;
  *(undefined8 *)&this->field_0x98 = 0xf67d50;
  *(undefined8 *)&this->field_0xf0 = 0xf67d78;
  *(undefined8 *)&this->field_0x148 = 0xf67da0;
  *(undefined8 *)&this->field_0x180 = 0xf67dc8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf67df0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}